

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testInit
          (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *this)

{
  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  Type TVar2;
  Type TVar3;
  Type TVar4;
  Type TVar5;
  Type TVar6;
  Type TVar7;
  Type TVar8;
  Type TVar9;
  Type TVar10;
  Type TVar11;
  Type TVar12;
  Type TVar13;
  Type TVar14;
  Type TVar15;
  Type TVar16;
  Type TVar17;
  Type TVar18;
  Type TVar19;
  Type TVar20;
  Type TVar21;
  Type TVar22;
  Type TVar23;
  Type TVar24;
  Type TVar25;
  Type TVar26;
  Type TVar27;
  Type TVar28;
  Type TVar29;
  Type TVar30;
  Type TVar31;
  TYPES TVar32;
  ulong uVar33;
  uint uVar34;
  GLuint GVar35;
  GLuint index;
  iterator iVar36;
  VaryingLocationAliasingWithMixedAuxiliaryStorageTest *this_01;
  GLuint j;
  GLuint index_00;
  bool *pbVar37;
  Type TVar38;
  Type TVar39;
  testCase local_2b0;
  testCase local_270;
  testCase local_230;
  testCase local_1f0;
  testCase local_1b0;
  testCase local_170;
  testCase local_130;
  testCase local_f0;
  testCase local_b0;
  testCase local_70;
  
  TVar29.m_n_rows = local_70.m_component_goten;
  TVar29._0_8_ = local_2b0.m_type_gohan._0_8_;
  TVar26.m_n_rows = local_b0.m_component_goten;
  TVar26._0_8_ = local_270.m_type_gohan._0_8_;
  TVar23.m_n_rows = local_f0.m_component_goten;
  TVar23._0_8_ = local_230.m_type_gohan._0_8_;
  TVar20.m_n_rows = local_130.m_component_goten;
  TVar20._0_8_ = local_1f0.m_type_gohan._0_8_;
  TVar17.m_n_rows = local_170.m_component_goten;
  TVar17._0_8_ = local_1b0.m_type_gohan._0_8_;
  TVar14.m_n_rows = local_1b0.m_component_goten;
  TVar14._0_8_ = local_170.m_type_gohan._0_8_;
  TVar11.m_n_rows = local_1f0.m_component_goten;
  TVar11._0_8_ = local_130.m_type_gohan._0_8_;
  TVar8.m_n_rows = local_230.m_component_goten;
  TVar8._0_8_ = local_f0.m_type_gohan._0_8_;
  TVar5.m_n_rows = local_270.m_component_goten;
  TVar5._0_8_ = local_b0.m_type_gohan._0_8_;
  TVar2.m_n_rows = local_2b0.m_component_goten;
  TVar2._0_8_ = local_70.m_type_gohan._0_8_;
  this_00 = &this->m_test_cases;
  index = 0;
  this_01 = this;
  do {
    local_70.m_component_goten = TVar29.m_n_rows;
    local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
    local_b0.m_component_goten = TVar26.m_n_rows;
    local_270.m_type_gohan._0_8_ = TVar26._0_8_;
    local_f0.m_component_goten = TVar23.m_n_rows;
    local_230.m_type_gohan._0_8_ = TVar23._0_8_;
    local_130.m_component_goten = TVar20.m_n_rows;
    local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
    local_170.m_component_goten = TVar17.m_n_rows;
    local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
    local_1b0.m_component_goten = TVar14.m_n_rows;
    local_170.m_type_gohan._0_8_ = TVar14._0_8_;
    local_1f0.m_component_goten = TVar11.m_n_rows;
    local_130.m_type_gohan._0_8_ = TVar11._0_8_;
    local_230.m_component_goten = TVar8.m_n_rows;
    local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
    local_270.m_component_goten = TVar5.m_n_rows;
    local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
    local_2b0.m_component_goten = TVar2.m_n_rows;
    local_70.m_type_gohan._0_8_ = TVar2._0_8_;
    TVar38 = TestBase::getType((TestBase *)this_01,index);
    TVar29.m_n_rows = local_70.m_component_goten;
    TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
    TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
    TVar26.m_n_rows = local_b0.m_component_goten;
    TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
    TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
    TVar23.m_n_rows = local_f0.m_component_goten;
    TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
    TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
    TVar20.m_n_rows = local_130.m_component_goten;
    TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
    TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
    TVar17.m_n_rows = local_170.m_component_goten;
    TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
    TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
    TVar14.m_n_rows = local_1b0.m_component_goten;
    TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
    TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
    TVar11.m_n_rows = local_1f0.m_component_goten;
    TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
    TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
    TVar8.m_n_rows = local_230.m_component_goten;
    TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
    TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
    TVar5.m_n_rows = local_270.m_component_goten;
    TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
    TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
    TVar2.m_n_rows = local_2b0.m_component_goten;
    TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
    TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
    uVar34 = TVar38.m_n_rows;
    uVar33 = TVar38._0_8_;
    if ((uVar33 & 0xffffffff00000000) == 0x100000000) {
      pbVar37 = (bool *)0x1a11cd0;
      if (TVar38.m_basic_type == Float) {
        pbVar37 = ::glcts::fixed_sample_locations_values + 1;
      }
      index_00 = 0;
      do {
        local_70.m_component_goten = TVar29.m_n_rows;
        local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
        local_b0.m_component_goten = TVar26.m_n_rows;
        local_270.m_type_gohan._0_8_ = TVar26._0_8_;
        local_f0.m_component_goten = TVar23.m_n_rows;
        local_230.m_type_gohan._0_8_ = TVar23._0_8_;
        local_130.m_component_goten = TVar20.m_n_rows;
        local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
        local_170.m_component_goten = TVar17.m_n_rows;
        local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
        local_1b0.m_component_goten = TVar14.m_n_rows;
        local_170.m_type_gohan._0_8_ = TVar14._0_8_;
        local_1f0.m_component_goten = TVar11.m_n_rows;
        local_130.m_type_gohan._0_8_ = TVar11._0_8_;
        local_230.m_component_goten = TVar8.m_n_rows;
        local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
        local_270.m_component_goten = TVar5.m_n_rows;
        local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
        local_2b0.m_component_goten = TVar2.m_n_rows;
        local_70.m_type_gohan._0_8_ = TVar2._0_8_;
        TVar39 = TestBase::getType((TestBase *)this_01,index_00);
        TVar31.m_n_rows = local_70.m_component_goten;
        TVar31.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
        TVar31.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
        TVar30.m_n_rows = local_70.m_component_goten;
        TVar30.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
        TVar30.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
        TVar29.m_n_rows = local_70.m_component_goten;
        TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
        TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
        TVar28.m_n_rows = local_b0.m_component_goten;
        TVar28.m_basic_type = local_270.m_type_gohan.m_basic_type;
        TVar28.m_n_columns = local_270.m_type_gohan.m_n_columns;
        TVar27.m_n_rows = local_b0.m_component_goten;
        TVar27.m_basic_type = local_270.m_type_gohan.m_basic_type;
        TVar27.m_n_columns = local_270.m_type_gohan.m_n_columns;
        TVar26.m_n_rows = local_b0.m_component_goten;
        TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
        TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
        TVar25.m_n_rows = local_f0.m_component_goten;
        TVar25.m_basic_type = local_230.m_type_gohan.m_basic_type;
        TVar25.m_n_columns = local_230.m_type_gohan.m_n_columns;
        TVar24.m_n_rows = local_f0.m_component_goten;
        TVar24.m_basic_type = local_230.m_type_gohan.m_basic_type;
        TVar24.m_n_columns = local_230.m_type_gohan.m_n_columns;
        TVar23.m_n_rows = local_f0.m_component_goten;
        TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
        TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
        TVar22.m_n_rows = local_130.m_component_goten;
        TVar22.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
        TVar22.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
        TVar21.m_n_rows = local_130.m_component_goten;
        TVar21.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
        TVar21.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
        TVar20.m_n_rows = local_130.m_component_goten;
        TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
        TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
        TVar19.m_n_rows = local_170.m_component_goten;
        TVar19.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
        TVar19.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
        TVar18.m_n_rows = local_170.m_component_goten;
        TVar18.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
        TVar18.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
        TVar17.m_n_rows = local_170.m_component_goten;
        TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
        TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
        TVar16.m_n_rows = local_1b0.m_component_goten;
        TVar16.m_basic_type = local_170.m_type_gohan.m_basic_type;
        TVar16.m_n_columns = local_170.m_type_gohan.m_n_columns;
        TVar15.m_n_rows = local_1b0.m_component_goten;
        TVar15.m_basic_type = local_170.m_type_gohan.m_basic_type;
        TVar15.m_n_columns = local_170.m_type_gohan.m_n_columns;
        TVar14.m_n_rows = local_1b0.m_component_goten;
        TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
        TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
        TVar13.m_n_rows = local_1f0.m_component_goten;
        TVar13.m_basic_type = local_130.m_type_gohan.m_basic_type;
        TVar13.m_n_columns = local_130.m_type_gohan.m_n_columns;
        TVar12.m_n_rows = local_1f0.m_component_goten;
        TVar12.m_basic_type = local_130.m_type_gohan.m_basic_type;
        TVar12.m_n_columns = local_130.m_type_gohan.m_n_columns;
        TVar11.m_n_rows = local_1f0.m_component_goten;
        TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
        TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
        TVar10.m_n_rows = local_230.m_component_goten;
        TVar10.m_basic_type = local_f0.m_type_gohan.m_basic_type;
        TVar10.m_n_columns = local_f0.m_type_gohan.m_n_columns;
        TVar9.m_n_rows = local_230.m_component_goten;
        TVar9.m_basic_type = local_f0.m_type_gohan.m_basic_type;
        TVar9.m_n_columns = local_f0.m_type_gohan.m_n_columns;
        TVar8.m_n_rows = local_230.m_component_goten;
        TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
        TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
        TVar7.m_n_rows = local_270.m_component_goten;
        TVar7.m_basic_type = local_b0.m_type_gohan.m_basic_type;
        TVar7.m_n_columns = local_b0.m_type_gohan.m_n_columns;
        TVar6.m_n_rows = local_270.m_component_goten;
        TVar6.m_basic_type = local_b0.m_type_gohan.m_basic_type;
        TVar6.m_n_columns = local_b0.m_type_gohan.m_n_columns;
        TVar5.m_n_rows = local_270.m_component_goten;
        TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
        TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
        TVar4.m_n_rows = local_2b0.m_component_goten;
        TVar4.m_basic_type = local_70.m_type_gohan.m_basic_type;
        TVar4.m_n_columns = local_70.m_type_gohan.m_n_columns;
        TVar3.m_n_rows = local_2b0.m_component_goten;
        TVar3.m_basic_type = local_70.m_type_gohan.m_basic_type;
        TVar3.m_n_columns = local_70.m_type_gohan.m_n_columns;
        TVar2.m_n_rows = local_2b0.m_component_goten;
        TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
        TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
        GVar35 = TVar39.m_n_rows;
        TVar32 = TVar39.m_basic_type;
        this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)0x100000000;
        if ((((TVar39._0_8_ & 0xffffffff00000000) == 0x100000000) &&
            (TVar2 = TVar3, TVar5 = TVar6, TVar8 = TVar9, TVar11 = TVar12, TVar14 = TVar15,
            TVar17 = TVar18, TVar20 = TVar21, TVar23 = TVar24, TVar26 = TVar27, TVar29 = TVar30,
            TVar38.m_basic_type < Int == TVar32 < Int)) &&
           (TVar2 = TVar4, TVar5 = TVar7, TVar8 = TVar10, TVar11 = TVar13, TVar14 = TVar16,
           TVar17 = TVar19, TVar20 = TVar22, TVar23 = TVar25, TVar26 = TVar28, TVar29 = TVar31,
           GVar35 + uVar34 < 5)) {
          local_2b0.m_int_goten = "flat";
          this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)
                    (::glcts::fixed_sample_locations_values + 1);
          if (TVar32 == Float) {
            local_2b0.m_int_goten = ::glcts::fixed_sample_locations_values + 1;
          }
          local_170.m_component_gohan = 0;
          local_170.m_aux_gohan = NONE;
          local_170.m_aux_goten = CENTROID;
          local_1b0.m_component_gohan = 0;
          local_1b0.m_aux_gohan = CENTROID;
          local_1b0.m_aux_goten = NONE;
          local_1f0.m_component_gohan = 0;
          local_1f0.m_aux_gohan = NONE;
          local_1f0.m_aux_goten = SAMPLE;
          local_230.m_component_gohan = 0;
          local_230.m_aux_gohan = SAMPLE;
          local_230.m_aux_goten = NONE;
          local_270.m_component_gohan = 0;
          local_270.m_aux_gohan = CENTROID;
          local_270.m_aux_goten = SAMPLE;
          local_2b0.m_component_gohan = 0;
          local_2b0.m_aux_gohan = SAMPLE;
          local_2b0.m_aux_goten = CENTROID;
          local_70.m_component_gohan = 0;
          local_70.m_aux_gohan = NONE;
          local_70.m_aux_goten = PATCH;
          local_70.m_int_gohan = ::glcts::fixed_sample_locations_values + 1;
          local_70.m_int_goten = ::glcts::fixed_sample_locations_values + 1;
          local_70._32_4_ = local_70._32_4_ & 0xffffff00;
          local_70.m_stage = TESS_CTRL;
          local_70.m_type_goten.m_n_columns = TVar39.m_n_columns;
          local_b0.m_component_gohan = 0;
          local_b0.m_aux_gohan = PATCH;
          local_b0.m_aux_goten = NONE;
          local_b0.m_int_gohan = ::glcts::fixed_sample_locations_values + 1;
          local_b0.m_int_goten = ::glcts::fixed_sample_locations_values + 1;
          local_b0._32_4_ = local_b0._32_4_ & 0xffffff00;
          local_b0.m_stage = TESS_CTRL;
          local_f0.m_component_gohan = 0;
          local_f0.m_aux_gohan = NONE;
          local_f0.m_aux_goten = PATCH;
          local_f0.m_int_gohan = ::glcts::fixed_sample_locations_values + 1;
          local_f0.m_int_goten = ::glcts::fixed_sample_locations_values + 1;
          local_f0.m_is_input = true;
          local_f0.m_stage = TESS_EVAL;
          local_130.m_component_gohan = 0;
          local_130.m_aux_gohan = PATCH;
          local_130.m_aux_goten = NONE;
          local_130.m_int_gohan = ::glcts::fixed_sample_locations_values + 1;
          local_130.m_int_goten = ::glcts::fixed_sample_locations_values + 1;
          local_130.m_is_input = true;
          local_130.m_stage = TESS_EVAL;
          local_170.m_is_input = true;
          local_170.m_stage = FRAGMENT;
          local_1b0.m_is_input = true;
          local_1b0.m_stage = FRAGMENT;
          local_1f0.m_is_input = true;
          local_1f0.m_stage = FRAGMENT;
          local_230.m_is_input = true;
          local_230.m_stage = FRAGMENT;
          local_270.m_is_input = true;
          local_270.m_stage = FRAGMENT;
          local_2b0.m_is_input = true;
          local_2b0.m_stage = FRAGMENT;
          iVar36._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_2b0.m_int_gohan = pbVar37;
          local_2b0.m_type_goten.m_basic_type = TVar32;
          local_2b0.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_2b0.m_type_goten.m_n_rows = GVar35;
          local_270.m_int_gohan = pbVar37;
          local_270.m_int_goten = local_2b0.m_int_goten;
          local_270.m_type_goten.m_basic_type = TVar32;
          local_270.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_270.m_type_goten.m_n_rows = GVar35;
          local_230.m_int_gohan = pbVar37;
          local_230.m_int_goten = local_2b0.m_int_goten;
          local_230.m_type_goten.m_basic_type = TVar32;
          local_230.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_230.m_type_goten.m_n_rows = GVar35;
          local_1f0.m_int_gohan = pbVar37;
          local_1f0.m_int_goten = local_2b0.m_int_goten;
          local_1f0.m_type_goten.m_basic_type = TVar32;
          local_1f0.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_1f0.m_type_goten.m_n_rows = GVar35;
          local_1b0.m_int_gohan = pbVar37;
          local_1b0.m_int_goten = local_2b0.m_int_goten;
          local_1b0.m_type_goten.m_basic_type = TVar32;
          local_1b0.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_1b0.m_type_goten.m_n_rows = GVar35;
          local_170.m_int_gohan = pbVar37;
          local_170.m_int_goten = local_2b0.m_int_goten;
          local_170.m_type_goten.m_basic_type = TVar32;
          local_170.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_170.m_type_goten.m_n_rows = GVar35;
          local_130.m_type_goten.m_basic_type = TVar32;
          local_130.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_130.m_type_goten.m_n_rows = GVar35;
          local_f0.m_type_goten.m_basic_type = TVar32;
          local_f0.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_f0.m_type_goten.m_n_rows = GVar35;
          local_b0.m_type_goten.m_basic_type = TVar32;
          local_b0.m_type_goten.m_n_columns = local_70.m_type_goten.m_n_columns;
          local_b0.m_type_goten.m_n_rows = GVar35;
          local_70.m_type_goten.m_basic_type = TVar32;
          local_70.m_type_goten.m_n_rows = GVar35;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            local_2b0.m_component_goten = uVar34;
            local_270.m_component_goten = uVar34;
            local_230.m_component_goten = uVar34;
            local_1f0.m_component_goten = uVar34;
            local_1b0.m_component_goten = uVar34;
            local_170.m_component_goten = uVar34;
            local_130.m_component_goten = uVar34;
            local_f0.m_component_goten = uVar34;
            local_b0.m_component_goten = uVar34;
            local_70.m_component_goten = uVar34;
            local_70.m_type_gohan = TVar38;
            local_b0.m_type_gohan = TVar38;
            local_f0.m_type_gohan = TVar38;
            local_130.m_type_gohan = TVar38;
            local_170.m_type_gohan = TVar38;
            local_1b0.m_type_gohan = TVar38;
            local_1f0.m_type_gohan = TVar38;
            local_230.m_type_gohan = TVar38;
            local_270.m_type_gohan = TVar38;
            local_2b0.m_type_gohan = TVar38;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_70);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows = CONCAT44(TVar32,uVar34);
            ((iVar36._M_current)->m_type_goten).m_n_columns = (int)TVar39._4_8_;
            ((iVar36._M_current)->m_type_goten).m_n_rows = (int)((ulong)TVar39._4_8_ >> 0x20);
            (iVar36._M_current)->m_is_input = (bool)local_70.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_70._33_3_;
            (iVar36._M_current)->m_stage = 2;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = (int)uVar33;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = (int)(uVar33 >> 0x20);
            (iVar36._M_current)->m_int_gohan = ::glcts::fixed_sample_locations_values + 1;
            (iVar36._M_current)->m_int_goten = ::glcts::fixed_sample_locations_values + 1;
            (iVar36._M_current)->m_component_gohan = (int)((ulong)uVar34 << 0x20);
            (iVar36._M_current)->m_component_goten = (int)(((ulong)uVar34 << 0x20) >> 0x20);
            (iVar36._M_current)->m_aux_gohan = NONE;
            (iVar36._M_current)->m_aux_goten = PATCH;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
            local_2b0.m_type_gohan.m_n_rows = uVar34;
            local_270.m_type_gohan.m_n_rows = uVar34;
            local_230.m_type_gohan.m_n_rows = uVar34;
            local_1f0.m_type_gohan.m_n_rows = uVar34;
            local_1b0.m_type_gohan.m_n_rows = uVar34;
            local_170.m_type_gohan.m_n_rows = uVar34;
            local_130.m_type_gohan.m_n_rows = uVar34;
            local_f0.m_type_gohan.m_n_rows = uVar34;
            local_b0.m_type_gohan.m_n_rows = uVar34;
            local_70.m_type_gohan.m_n_rows = uVar34;
            TVar2 = TVar38;
            TVar5 = TVar38;
            TVar8 = TVar38;
            TVar11 = TVar38;
            TVar14 = TVar38;
            TVar17 = TVar38;
            TVar20 = TVar38;
            TVar23 = TVar38;
            TVar26 = TVar38;
            TVar29 = TVar38;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_b0);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_b0.m_type_goten.m_basic_type,local_b0.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_b0.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_b0.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_b0.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_b0._33_3_;
            (iVar36._M_current)->m_stage = local_b0.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_b0.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_b0.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_b0.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_b0.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_b0.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_b0.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_b0.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_b0.m_aux_goten;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_f0);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_f0.m_type_goten.m_basic_type,local_f0.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_f0.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_f0.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_f0.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_f0._33_3_;
            (iVar36._M_current)->m_stage = local_f0.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_f0.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_f0.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_f0.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_f0.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_f0.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_f0.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_f0.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_f0.m_aux_goten;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_130);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_130.m_type_goten.m_basic_type,local_130.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_130.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_130.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_130.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_130._33_3_;
            (iVar36._M_current)->m_stage = local_130.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_130.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_130.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_130.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_130.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_130.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_130.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_130.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_130.m_aux_goten;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_170);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_170.m_type_goten.m_basic_type,local_170.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_170.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_170.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_170.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_170._33_3_;
            (iVar36._M_current)->m_stage = local_170.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_170.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_170.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_170.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_170.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_170.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_170.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_170.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_170.m_aux_goten;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_1b0);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_1b0.m_type_goten.m_basic_type,local_1b0.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_1b0.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_1b0.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_1b0.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_1b0._33_3_;
            (iVar36._M_current)->m_stage = local_1b0.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_1b0.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_1b0.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_1b0.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_1b0.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_1b0.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_1b0.m_aux_goten;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_1f0);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_1f0.m_type_goten.m_basic_type,local_1f0.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_1f0.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_1f0.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_1f0.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_1f0._33_3_;
            (iVar36._M_current)->m_stage = local_1f0.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_1f0.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_1f0.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_1f0.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_1f0.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_1f0.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_1f0.m_aux_goten;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_230);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_230.m_type_goten.m_basic_type,local_230.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_230.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_230.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_230.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_230._33_3_;
            (iVar36._M_current)->m_stage = local_230.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_230.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_230.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_230.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_230.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_230.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_230.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_230.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_230.m_aux_goten;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_270);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_270.m_type_goten.m_basic_type,local_270.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_270.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_270.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_270.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_270._33_3_;
            (iVar36._M_current)->m_stage = local_270.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_270.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_270.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_270.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_270.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_270.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_270.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_270.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_270.m_aux_goten;
            iVar36._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar36._M_current;
          }
          local_70.m_component_goten = TVar29.m_n_rows;
          local_2b0.m_type_gohan._0_8_ = TVar29._0_8_;
          local_b0.m_component_goten = TVar26.m_n_rows;
          local_270.m_type_gohan._0_8_ = TVar26._0_8_;
          local_f0.m_component_goten = TVar23.m_n_rows;
          local_230.m_type_gohan._0_8_ = TVar23._0_8_;
          local_130.m_component_goten = TVar20.m_n_rows;
          local_1f0.m_type_gohan._0_8_ = TVar20._0_8_;
          local_170.m_component_goten = TVar17.m_n_rows;
          local_1b0.m_type_gohan._0_8_ = TVar17._0_8_;
          local_1b0.m_component_goten = TVar14.m_n_rows;
          local_170.m_type_gohan._0_8_ = TVar14._0_8_;
          local_1f0.m_component_goten = TVar11.m_n_rows;
          local_130.m_type_gohan._0_8_ = TVar11._0_8_;
          local_230.m_component_goten = TVar8.m_n_rows;
          local_f0.m_type_gohan._0_8_ = TVar8._0_8_;
          local_270.m_component_goten = TVar5.m_n_rows;
          local_b0.m_type_gohan._0_8_ = TVar5._0_8_;
          local_2b0.m_component_goten = TVar2.m_n_rows;
          local_70.m_type_gohan._0_8_ = TVar2._0_8_;
          if (iVar36._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>>
                        *)this_00,iVar36,&local_2b0);
            TVar29.m_n_rows = local_70.m_component_goten;
            TVar29.m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            TVar29.m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            TVar26.m_n_rows = local_b0.m_component_goten;
            TVar26.m_basic_type = local_270.m_type_gohan.m_basic_type;
            TVar26.m_n_columns = local_270.m_type_gohan.m_n_columns;
            TVar23.m_n_rows = local_f0.m_component_goten;
            TVar23.m_basic_type = local_230.m_type_gohan.m_basic_type;
            TVar23.m_n_columns = local_230.m_type_gohan.m_n_columns;
            TVar20.m_n_rows = local_130.m_component_goten;
            TVar20.m_basic_type = local_1f0.m_type_gohan.m_basic_type;
            TVar20.m_n_columns = local_1f0.m_type_gohan.m_n_columns;
            TVar17.m_n_rows = local_170.m_component_goten;
            TVar17.m_basic_type = local_1b0.m_type_gohan.m_basic_type;
            TVar17.m_n_columns = local_1b0.m_type_gohan.m_n_columns;
            TVar14.m_n_rows = local_1b0.m_component_goten;
            TVar14.m_basic_type = local_170.m_type_gohan.m_basic_type;
            TVar14.m_n_columns = local_170.m_type_gohan.m_n_columns;
            TVar11.m_n_rows = local_1f0.m_component_goten;
            TVar11.m_basic_type = local_130.m_type_gohan.m_basic_type;
            TVar11.m_n_columns = local_130.m_type_gohan.m_n_columns;
            TVar8.m_n_rows = local_230.m_component_goten;
            TVar8.m_basic_type = local_f0.m_type_gohan.m_basic_type;
            TVar8.m_n_columns = local_f0.m_type_gohan.m_n_columns;
            TVar5.m_n_rows = local_270.m_component_goten;
            TVar5.m_basic_type = local_b0.m_type_gohan.m_basic_type;
            TVar5.m_n_columns = local_b0.m_type_gohan.m_n_columns;
            TVar2.m_n_rows = local_2b0.m_component_goten;
            TVar2.m_basic_type = local_70.m_type_gohan.m_basic_type;
            TVar2.m_n_columns = local_70.m_type_gohan.m_n_columns;
          }
          else {
            *(ulong *)&((iVar36._M_current)->m_type_gohan).m_n_rows =
                 CONCAT44(local_2b0.m_type_goten.m_basic_type,local_2b0.m_type_gohan.m_n_rows);
            ((iVar36._M_current)->m_type_goten).m_n_columns = local_2b0.m_type_goten.m_n_columns;
            ((iVar36._M_current)->m_type_goten).m_n_rows = local_2b0.m_type_goten.m_n_rows;
            (iVar36._M_current)->m_is_input = (bool)local_2b0.m_is_input;
            *(int3 *)&(iVar36._M_current)->field_0x21 = local_2b0._33_3_;
            (iVar36._M_current)->m_stage = local_2b0.m_stage;
            ((iVar36._M_current)->m_type_gohan).m_basic_type = local_2b0.m_type_gohan.m_basic_type;
            ((iVar36._M_current)->m_type_gohan).m_n_columns = local_2b0.m_type_gohan.m_n_columns;
            (iVar36._M_current)->m_int_gohan = local_2b0.m_int_gohan;
            (iVar36._M_current)->m_int_goten = local_2b0.m_int_goten;
            (iVar36._M_current)->m_component_gohan = local_2b0.m_component_gohan;
            (iVar36._M_current)->m_component_goten = local_2b0.m_component_goten;
            (iVar36._M_current)->m_aux_gohan = local_2b0.m_aux_gohan;
            (iVar36._M_current)->m_aux_goten = local_2b0.m_aux_goten;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
        }
        index_00 = index_00 + 1;
      } while (index_00 != 0x22);
    }
    index = index + 1;
  } while (index != 0x22);
  return;
}

Assistant:

void VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_flat_req_gohan   = (Utils::Type::Float == type_gohan.m_basic_type) ? false : true;
			const bool		   is_flat_req_goten   = (Utils::Type::Float == type_goten.m_basic_type) ? false : true;
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip invalid combinations */
			if (is_float_type_gohan != is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			const GLuint gohan = 0;
			const GLuint goten = gohan + n_req_components_gohan;

			const GLchar* fs_int_gohan = is_flat_req_gohan ? "flat" : "";
			const GLchar* fs_int_goten = is_flat_req_goten ? "flat" : "";

			testCase test_case_tcs_np = { gohan,	  goten,	 NONE, PATCH, "", "", false, Utils::Shader::TESS_CTRL,
										  type_gohan, type_goten };

			testCase test_case_tcs_pn = { gohan,	  goten,	 PATCH, NONE, "", "", false, Utils::Shader::TESS_CTRL,
										  type_gohan, type_goten };

			testCase test_case_tes_np = { gohan,	  goten,	 NONE, PATCH, "", "", true, Utils::Shader::TESS_EVAL,
										  type_gohan, type_goten };

			testCase test_case_tes_pn = { gohan,	  goten,	 PATCH, NONE, "", "", true, Utils::Shader::TESS_EVAL,
										  type_gohan, type_goten };

			testCase test_case_fs_nc = { gohan,		   goten,		 NONE, CENTROID,
										 fs_int_gohan, fs_int_goten, true, Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_cn = { gohan,		   goten,		 CENTROID, NONE,
										 fs_int_gohan, fs_int_goten, true,	 Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_ns = { gohan,		   goten,		 NONE, SAMPLE,
										 fs_int_gohan, fs_int_goten, true, Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_sn = { gohan,		   goten,		 SAMPLE, NONE,
										 fs_int_gohan, fs_int_goten, true,   Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_cs = { gohan,		   goten,		 CENTROID, SAMPLE,
										 fs_int_gohan, fs_int_goten, true,	 Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_sc = { gohan,		   goten,		 SAMPLE, CENTROID,
										 fs_int_gohan, fs_int_goten, true,   Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			m_test_cases.push_back(test_case_tcs_np);
			m_test_cases.push_back(test_case_tcs_pn);
			m_test_cases.push_back(test_case_tes_np);
			m_test_cases.push_back(test_case_tes_pn);
			m_test_cases.push_back(test_case_fs_nc);
			m_test_cases.push_back(test_case_fs_cn);
			m_test_cases.push_back(test_case_fs_ns);
			m_test_cases.push_back(test_case_fs_sn);
			m_test_cases.push_back(test_case_fs_cs);
			m_test_cases.push_back(test_case_fs_sc);
		}
	}
}